

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkImageScaler::MergeFrom
          (NeuralNetworkImageScaler *this,NeuralNetworkImageScaler *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xa04);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  fVar1 = from->graybias_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->graybias_ = fVar1;
  }
  fVar1 = from->channelscale_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->channelscale_ = fVar1;
  }
  fVar1 = from->bluebias_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->bluebias_ = fVar1;
  }
  fVar1 = from->greenbias_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->greenbias_ = fVar1;
  }
  fVar1 = from->redbias_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->redbias_ = fVar1;
  }
  return;
}

Assistant:

void NeuralNetworkImageScaler::MergeFrom(const NeuralNetworkImageScaler& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkImageScaler)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.graybias() != 0) {
    set_graybias(from.graybias());
  }
  if (from.channelscale() != 0) {
    set_channelscale(from.channelscale());
  }
  if (from.bluebias() != 0) {
    set_bluebias(from.bluebias());
  }
  if (from.greenbias() != 0) {
    set_greenbias(from.greenbias());
  }
  if (from.redbias() != 0) {
    set_redbias(from.redbias());
  }
}